

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TtManStop(Abc_TtMan_t *p)

{
  int local_14;
  int i;
  Abc_TtMan_t *p_local;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    Vec_MemHashFree(p->vTtMem[local_14]);
    Vec_MemFreeP(p->vTtMem + local_14);
  }
  if (p != (Abc_TtMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_TtManStop( Abc_TtMan_t * p )
{
    int i;
    for ( i = 0; i < TT_NUM_TABLES; i++ )
    {
        Vec_MemHashFree( p->vTtMem[i] );
        Vec_MemFreeP( &p->vTtMem[i] );
    }
    ABC_FREE( p );
}